

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O0

int verifyrule(lua_State *L,TTree *tree,int *passed,int npassed,int nb)

{
  int iVar1;
  int local_30;
  int local_2c;
  int nb_local;
  int npassed_local;
  int *passed_local;
  TTree *tree_local;
  lua_State *L_local;
  
  local_30 = nb;
  local_2c = npassed;
  passed_local = (int *)tree;
  do {
    switch((char)*passed_local) {
    case '\0':
    case '\x01':
    case '\x02':
    case '\x04':
      return local_30;
    case '\x03':
    case '\x0e':
      return 1;
    case '\x05':
    case '\b':
    case '\t':
      passed_local = passed_local + 2;
      local_30 = 1;
      break;
    case '\x06':
      iVar1 = verifyrule(L,(TTree *)(passed_local + 2),passed,local_2c,0);
      if (iVar1 == 0) {
        return local_30;
      }
      passed_local = passed_local + (long)passed_local[1] * 2;
      break;
    case '\a':
      local_30 = verifyrule(L,(TTree *)(passed_local + 2),passed,local_2c,local_30);
      passed_local = passed_local + (long)passed_local[1] * 2;
      break;
    case '\n':
      passed_local = passed_local + (long)passed_local[1] * 2;
      break;
    default:
      return 0;
    case '\f':
      if (999 < local_2c) {
        iVar1 = verifyerror(L,passed,local_2c);
        return iVar1;
      }
      passed[local_2c] = (uint)*(ushort *)((long)passed_local + 2);
      passed_local = passed_local + 2;
      local_2c = local_2c + 1;
      break;
    case '\r':
      iVar1 = checkaux((TTree *)passed_local,0);
      return iVar1;
    case '\x0f':
    case '\x10':
      passed_local = passed_local + 2;
    }
  } while( true );
}

Assistant:

static int verifyrule (lua_State *L, TTree *tree, int *passed, int npassed,
                       int nb) {
 tailcall:
  switch (tree->tag) {
    case TChar: case TSet: case TAny:
    case TFalse:
      return nb;  /* cannot pass from here */
    case TTrue:
    case TBehind:  /* look-behind cannot have calls */
      return 1;
    case TNot: case TAnd: case TRep:
      /* return verifyrule(L, sib1(tree), passed, npassed, 1); */
      tree = sib1(tree); nb = 1; goto tailcall;
    case TCapture: case TRunTime:
      /* return verifyrule(L, sib1(tree), passed, npassed, nb); */
      tree = sib1(tree); goto tailcall;
    case TCall:
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TSeq:  /* only check 2nd child if first is nb */
      if (!verifyrule(L, sib1(tree), passed, npassed, 0))
        return nb;
      /* else return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TChoice:  /* must check both children */
      nb = verifyrule(L, sib1(tree), passed, npassed, nb);
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TRule:
      if (npassed >= MAXRULES)
        return verifyerror(L, passed, npassed);
      else {
        passed[npassed++] = tree->key;
        /* return verifyrule(L, sib1(tree), passed, npassed); */
        tree = sib1(tree); goto tailcall;
      }
    case TGrammar:
      return nullable(tree);  /* sub-grammar cannot be left recursive */
    default: assert(0); return 0;
  }
}